

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# numparse_impl.cpp
# Opt level: O0

NumberParserImpl *
icu_63::numparse::impl::NumberParserImpl::createSimpleParser
          (Locale *locale,UnicodeString *patternString,parse_flags_t parseFlags,UErrorCode *status)

{
  NumberParserImpl *pNVar1;
  NumberParserImpl *pNVar2;
  DecimalMatcher *pDVar3;
  MinusSignMatcher *pMVar4;
  PlusSignMatcher *pPVar5;
  PercentMatcher *pPVar6;
  PermilleMatcher *pPVar7;
  NanMatcher *pNVar8;
  InfinityMatcher *pIVar9;
  PaddingMatcher *pPVar10;
  ScientificMatcher *pSVar11;
  CombinedCurrencyMatcher *pCVar12;
  NumberParserImpl *local_29b8;
  CombinedCurrencyMatcher local_29b0;
  ScientificMatcher local_26d8;
  UnicodeString local_2548;
  PaddingMatcher local_2508;
  InfinityMatcher local_24b8;
  NanMatcher local_2468;
  PermilleMatcher local_2418;
  PercentMatcher local_23c8;
  PlusSignMatcher local_2378;
  MinusSignMatcher local_2320;
  DecimalMatcher local_22c8;
  Grouper local_2200;
  undefined1 local_21f0 [8];
  Grouper grouper;
  AffixTokenMatcherWarehouse local_1ed8;
  undefined1 local_1a20 [8];
  AffixTokenMatcherSetupData affixSetupData;
  ParsedPatternInfo patternInfo;
  CurrencyUnit local_1828;
  undefined1 local_1808 [8];
  CurrencySymbols currencySymbols;
  UnicodeString local_16e0;
  undefined1 local_16a0 [8];
  DecimalFormatSymbols dfs;
  IgnorablesMatcher *ignorables;
  undefined1 local_b48 [8];
  DecimalFormatSymbols symbols;
  LocalPointerBase<icu_63::numparse::impl::NumberParserImpl> local_30;
  LocalPointer<icu_63::numparse::impl::NumberParserImpl> parser;
  UErrorCode *status_local;
  parse_flags_t parseFlags_local;
  UnicodeString *patternString_local;
  Locale *locale_local;
  
  parser.super_LocalPointerBase<icu_63::numparse::impl::NumberParserImpl>.ptr =
       (LocalPointerBase<icu_63::numparse::impl::NumberParserImpl>)
       (LocalPointerBase<icu_63::numparse::impl::NumberParserImpl>)status;
  pNVar1 = (NumberParserImpl *)UMemory::operator_new((UMemory *)0x1040,(size_t)patternString);
  local_29b8 = (NumberParserImpl *)0x0;
  if (pNVar1 != (NumberParserImpl *)0x0) {
    NumberParserImpl(pNVar1,parseFlags);
    local_29b8 = pNVar1;
  }
  LocalPointer<icu_63::numparse::impl::NumberParserImpl>::LocalPointer
            ((LocalPointer<icu_63::numparse::impl::NumberParserImpl> *)&local_30,local_29b8);
  DecimalFormatSymbols::DecimalFormatSymbols
            ((DecimalFormatSymbols *)local_b48,locale,
             (UErrorCode *)
             parser.super_LocalPointerBase<icu_63::numparse::impl::NumberParserImpl>.ptr);
  IgnorablesMatcher::IgnorablesMatcher((IgnorablesMatcher *)&ignorables,DEFAULT_IGNORABLES);
  pNVar1 = LocalPointerBase<icu_63::numparse::impl::NumberParserImpl>::operator->(&local_30);
  IgnorablesMatcher::operator=
            (&(pNVar1->fLocalMatchers).ignorables,(IgnorablesMatcher *)&ignorables);
  IgnorablesMatcher::~IgnorablesMatcher((IgnorablesMatcher *)&ignorables);
  pNVar1 = LocalPointerBase<icu_63::numparse::impl::NumberParserImpl>::operator->(&local_30);
  dfs._2808_8_ = &pNVar1->fLocalMatchers;
  DecimalFormatSymbols::DecimalFormatSymbols
            ((DecimalFormatSymbols *)local_16a0,locale,
             (UErrorCode *)
             parser.super_LocalPointerBase<icu_63::numparse::impl::NumberParserImpl>.ptr);
  UnicodeString::UnicodeString(&local_16e0,L"IU$");
  DecimalFormatSymbols::setSymbol
            ((DecimalFormatSymbols *)local_16a0,kCurrencySymbol,&local_16e0,'\x01');
  UnicodeString::~UnicodeString(&local_16e0);
  UnicodeString::UnicodeString
            ((UnicodeString *)((long)&currencySymbols.fIntlCurrencySymbol.fUnion + 0x30),L"ICU");
  DecimalFormatSymbols::setSymbol
            ((DecimalFormatSymbols *)local_16a0,kIntlCurrencySymbol,
             (UnicodeString *)((long)&currencySymbols.fIntlCurrencySymbol.fUnion + 0x30),'\x01');
  UnicodeString::~UnicodeString
            ((UnicodeString *)((long)&currencySymbols.fIntlCurrencySymbol.fUnion + 0x30));
  ConstChar16Ptr::ConstChar16Ptr((ConstChar16Ptr *)&patternInfo.fHasNegativeSubpattern,L"ICU");
  CurrencyUnit::CurrencyUnit
            (&local_1828,(ConstChar16Ptr *)&patternInfo.fHasNegativeSubpattern,
             (UErrorCode *)
             parser.super_LocalPointerBase<icu_63::numparse::impl::NumberParserImpl>.ptr);
  icu_63::number::impl::CurrencySymbols::CurrencySymbols
            ((CurrencySymbols *)local_1808,&local_1828,locale,(DecimalFormatSymbols *)local_16a0,
             (UErrorCode *)
             parser.super_LocalPointerBase<icu_63::numparse::impl::NumberParserImpl>.ptr);
  CurrencyUnit::~CurrencyUnit(&local_1828);
  ConstChar16Ptr::~ConstChar16Ptr((ConstChar16Ptr *)&patternInfo.fHasNegativeSubpattern);
  icu_63::number::impl::ParsedPatternInfo::ParsedPatternInfo
            ((ParsedPatternInfo *)&affixSetupData.parseFlags);
  icu_63::number::impl::PatternParser::parseToPatternInfo
            (patternString,(ParsedPatternInfo *)&affixSetupData.parseFlags,
             (UErrorCode *)
             parser.super_LocalPointerBase<icu_63::numparse::impl::NumberParserImpl>.ptr);
  local_1a20 = (undefined1  [8])local_1808;
  affixSetupData.currencySymbols = (CurrencySymbols *)local_b48;
  affixSetupData.dfs = (DecimalFormatSymbols *)dfs._2808_8_;
  affixSetupData.ignorables = (IgnorablesMatcher *)locale;
  affixSetupData.locale._0_4_ = parseFlags;
  AffixTokenMatcherWarehouse::AffixTokenMatcherWarehouse
            (&local_1ed8,(AffixTokenMatcherSetupData *)local_1a20);
  pNVar1 = LocalPointerBase<icu_63::numparse::impl::NumberParserImpl>::operator->(&local_30);
  AffixTokenMatcherWarehouse::operator=
            (&(pNVar1->fLocalMatchers).affixTokenMatcherWarehouse,&local_1ed8);
  AffixTokenMatcherWarehouse::~AffixTokenMatcherWarehouse(&local_1ed8);
  pNVar1 = LocalPointerBase<icu_63::numparse::impl::NumberParserImpl>::operator->(&local_30);
  AffixMatcherWarehouse::AffixMatcherWarehouse
            ((AffixMatcherWarehouse *)&grouper.fStrategy,
             &(pNVar1->fLocalMatchers).affixTokenMatcherWarehouse);
  pNVar1 = LocalPointerBase<icu_63::numparse::impl::NumberParserImpl>::operator->(&local_30);
  AffixMatcherWarehouse::operator=
            (&(pNVar1->fLocalMatchers).affixMatcherWarehouse,
             (AffixMatcherWarehouse *)&grouper.fStrategy);
  AffixMatcherWarehouse::~AffixMatcherWarehouse((AffixMatcherWarehouse *)&grouper.fStrategy);
  pNVar1 = LocalPointerBase<icu_63::numparse::impl::NumberParserImpl>::operator->(&local_30);
  pNVar2 = LocalPointerBase<icu_63::numparse::impl::NumberParserImpl>::operator*(&local_30);
  AffixMatcherWarehouse::createAffixMatchers
            (&(pNVar1->fLocalMatchers).affixMatcherWarehouse,
             (AffixPatternProvider *)&affixSetupData.parseFlags,
             &pNVar2->super_MutableMatcherCollection,(IgnorablesMatcher *)dfs._2808_8_,parseFlags,
             (UErrorCode *)
             parser.super_LocalPointerBase<icu_63::numparse::impl::NumberParserImpl>.ptr);
  local_2200 = icu_63::number::impl::Grouper::forStrategy(UNUM_GROUPING_AUTO);
  grouper._0_4_ = local_2200.fStrategy;
  local_21f0 = local_2200._0_8_;
  icu_63::number::impl::Grouper::setLocaleData
            ((Grouper *)local_21f0,(ParsedPatternInfo *)&affixSetupData.parseFlags,locale);
  pNVar1 = LocalPointerBase<icu_63::numparse::impl::NumberParserImpl>::operator->(&local_30);
  pNVar2 = LocalPointerBase<icu_63::numparse::impl::NumberParserImpl>::operator->(&local_30);
  (*(pNVar1->super_MutableMatcherCollection)._vptr_MutableMatcherCollection[2])
            (pNVar1,&pNVar2->fLocalMatchers);
  pNVar1 = LocalPointerBase<icu_63::numparse::impl::NumberParserImpl>::operator->(&local_30);
  DecimalMatcher::DecimalMatcher
            (&local_22c8,(DecimalFormatSymbols *)local_b48,(Grouper *)local_21f0,parseFlags);
  pNVar2 = LocalPointerBase<icu_63::numparse::impl::NumberParserImpl>::operator->(&local_30);
  pDVar3 = DecimalMatcher::operator=(&(pNVar2->fLocalMatchers).decimal,&local_22c8);
  (*(pNVar1->super_MutableMatcherCollection)._vptr_MutableMatcherCollection[2])(pNVar1,pDVar3);
  DecimalMatcher::~DecimalMatcher(&local_22c8);
  pNVar1 = LocalPointerBase<icu_63::numparse::impl::NumberParserImpl>::operator->(&local_30);
  MinusSignMatcher::MinusSignMatcher(&local_2320,(DecimalFormatSymbols *)local_b48,false);
  pNVar2 = LocalPointerBase<icu_63::numparse::impl::NumberParserImpl>::operator->(&local_30);
  pMVar4 = MinusSignMatcher::operator=(&(pNVar2->fLocalMatchers).minusSign,&local_2320);
  (*(pNVar1->super_MutableMatcherCollection)._vptr_MutableMatcherCollection[2])(pNVar1,pMVar4);
  MinusSignMatcher::~MinusSignMatcher(&local_2320);
  pNVar1 = LocalPointerBase<icu_63::numparse::impl::NumberParserImpl>::operator->(&local_30);
  PlusSignMatcher::PlusSignMatcher(&local_2378,(DecimalFormatSymbols *)local_b48,false);
  pNVar2 = LocalPointerBase<icu_63::numparse::impl::NumberParserImpl>::operator->(&local_30);
  pPVar5 = PlusSignMatcher::operator=(&(pNVar2->fLocalMatchers).plusSign,&local_2378);
  (*(pNVar1->super_MutableMatcherCollection)._vptr_MutableMatcherCollection[2])(pNVar1,pPVar5);
  PlusSignMatcher::~PlusSignMatcher(&local_2378);
  pNVar1 = LocalPointerBase<icu_63::numparse::impl::NumberParserImpl>::operator->(&local_30);
  PercentMatcher::PercentMatcher(&local_23c8,(DecimalFormatSymbols *)local_b48);
  pNVar2 = LocalPointerBase<icu_63::numparse::impl::NumberParserImpl>::operator->(&local_30);
  pPVar6 = PercentMatcher::operator=(&(pNVar2->fLocalMatchers).percent,&local_23c8);
  (*(pNVar1->super_MutableMatcherCollection)._vptr_MutableMatcherCollection[2])(pNVar1,pPVar6);
  PercentMatcher::~PercentMatcher(&local_23c8);
  pNVar1 = LocalPointerBase<icu_63::numparse::impl::NumberParserImpl>::operator->(&local_30);
  PermilleMatcher::PermilleMatcher(&local_2418,(DecimalFormatSymbols *)local_b48);
  pNVar2 = LocalPointerBase<icu_63::numparse::impl::NumberParserImpl>::operator->(&local_30);
  pPVar7 = PermilleMatcher::operator=(&(pNVar2->fLocalMatchers).permille,&local_2418);
  (*(pNVar1->super_MutableMatcherCollection)._vptr_MutableMatcherCollection[2])(pNVar1,pPVar7);
  PermilleMatcher::~PermilleMatcher(&local_2418);
  pNVar1 = LocalPointerBase<icu_63::numparse::impl::NumberParserImpl>::operator->(&local_30);
  NanMatcher::NanMatcher(&local_2468,(DecimalFormatSymbols *)local_b48);
  pNVar2 = LocalPointerBase<icu_63::numparse::impl::NumberParserImpl>::operator->(&local_30);
  pNVar8 = NanMatcher::operator=(&(pNVar2->fLocalMatchers).nan,&local_2468);
  (*(pNVar1->super_MutableMatcherCollection)._vptr_MutableMatcherCollection[2])(pNVar1,pNVar8);
  NanMatcher::~NanMatcher(&local_2468);
  pNVar1 = LocalPointerBase<icu_63::numparse::impl::NumberParserImpl>::operator->(&local_30);
  InfinityMatcher::InfinityMatcher(&local_24b8,(DecimalFormatSymbols *)local_b48);
  pNVar2 = LocalPointerBase<icu_63::numparse::impl::NumberParserImpl>::operator->(&local_30);
  pIVar9 = InfinityMatcher::operator=(&(pNVar2->fLocalMatchers).infinity,&local_24b8);
  (*(pNVar1->super_MutableMatcherCollection)._vptr_MutableMatcherCollection[2])(pNVar1,pIVar9);
  InfinityMatcher::~InfinityMatcher(&local_24b8);
  pNVar1 = LocalPointerBase<icu_63::numparse::impl::NumberParserImpl>::operator->(&local_30);
  UnicodeString::UnicodeString(&local_2548,L"@");
  PaddingMatcher::PaddingMatcher(&local_2508,&local_2548);
  pNVar2 = LocalPointerBase<icu_63::numparse::impl::NumberParserImpl>::operator->(&local_30);
  pPVar10 = PaddingMatcher::operator=(&(pNVar2->fLocalMatchers).padding,&local_2508);
  (*(pNVar1->super_MutableMatcherCollection)._vptr_MutableMatcherCollection[2])(pNVar1,pPVar10);
  PaddingMatcher::~PaddingMatcher(&local_2508);
  UnicodeString::~UnicodeString(&local_2548);
  pNVar1 = LocalPointerBase<icu_63::numparse::impl::NumberParserImpl>::operator->(&local_30);
  ScientificMatcher::ScientificMatcher
            (&local_26d8,(DecimalFormatSymbols *)local_b48,(Grouper *)local_21f0);
  pNVar2 = LocalPointerBase<icu_63::numparse::impl::NumberParserImpl>::operator->(&local_30);
  pSVar11 = ScientificMatcher::operator=(&(pNVar2->fLocalMatchers).scientific,&local_26d8);
  (*(pNVar1->super_MutableMatcherCollection)._vptr_MutableMatcherCollection[2])(pNVar1,pSVar11);
  ScientificMatcher::~ScientificMatcher(&local_26d8);
  pNVar1 = LocalPointerBase<icu_63::numparse::impl::NumberParserImpl>::operator->(&local_30);
  CombinedCurrencyMatcher::CombinedCurrencyMatcher
            (&local_29b0,(CurrencySymbols *)local_1808,(DecimalFormatSymbols *)local_b48,parseFlags,
             (UErrorCode *)
             parser.super_LocalPointerBase<icu_63::numparse::impl::NumberParserImpl>.ptr);
  pNVar2 = LocalPointerBase<icu_63::numparse::impl::NumberParserImpl>::operator->(&local_30);
  pCVar12 = CombinedCurrencyMatcher::operator=(&(pNVar2->fLocalMatchers).currency,&local_29b0);
  (*(pNVar1->super_MutableMatcherCollection)._vptr_MutableMatcherCollection[2])(pNVar1,pCVar12);
  CombinedCurrencyMatcher::~CombinedCurrencyMatcher(&local_29b0);
  pNVar1 = LocalPointerBase<icu_63::numparse::impl::NumberParserImpl>::operator->(&local_30);
  freeze(pNVar1);
  pNVar1 = LocalPointerBase<icu_63::numparse::impl::NumberParserImpl>::orphan(&local_30);
  icu_63::number::impl::ParsedPatternInfo::~ParsedPatternInfo
            ((ParsedPatternInfo *)&affixSetupData.parseFlags);
  icu_63::number::impl::CurrencySymbols::~CurrencySymbols((CurrencySymbols *)local_1808);
  DecimalFormatSymbols::~DecimalFormatSymbols((DecimalFormatSymbols *)local_16a0);
  DecimalFormatSymbols::~DecimalFormatSymbols((DecimalFormatSymbols *)local_b48);
  LocalPointer<icu_63::numparse::impl::NumberParserImpl>::~LocalPointer
            ((LocalPointer<icu_63::numparse::impl::NumberParserImpl> *)&local_30);
  return pNVar1;
}

Assistant:

NumberParserImpl*
NumberParserImpl::createSimpleParser(const Locale& locale, const UnicodeString& patternString,
                                     parse_flags_t parseFlags, UErrorCode& status) {

    LocalPointer<NumberParserImpl> parser(new NumberParserImpl(parseFlags));
    DecimalFormatSymbols symbols(locale, status);

    parser->fLocalMatchers.ignorables = {unisets::DEFAULT_IGNORABLES};
    IgnorablesMatcher& ignorables = parser->fLocalMatchers.ignorables;

    DecimalFormatSymbols dfs(locale, status);
    dfs.setSymbol(DecimalFormatSymbols::kCurrencySymbol, u"IU$");
    dfs.setSymbol(DecimalFormatSymbols::kIntlCurrencySymbol, u"ICU");
    CurrencySymbols currencySymbols({u"ICU", status}, locale, dfs, status);

    ParsedPatternInfo patternInfo;
    PatternParser::parseToPatternInfo(patternString, patternInfo, status);

    // The following statements set up the affix matchers.
    AffixTokenMatcherSetupData affixSetupData = {
            currencySymbols, symbols, ignorables, locale, parseFlags};
    parser->fLocalMatchers.affixTokenMatcherWarehouse = {&affixSetupData};
    parser->fLocalMatchers.affixMatcherWarehouse = {&parser->fLocalMatchers.affixTokenMatcherWarehouse};
    parser->fLocalMatchers.affixMatcherWarehouse.createAffixMatchers(
            patternInfo, *parser, ignorables, parseFlags, status);

    Grouper grouper = Grouper::forStrategy(UNUM_GROUPING_AUTO);
    grouper.setLocaleData(patternInfo, locale);

    parser->addMatcher(parser->fLocalMatchers.ignorables);
    parser->addMatcher(parser->fLocalMatchers.decimal = {symbols, grouper, parseFlags});
    parser->addMatcher(parser->fLocalMatchers.minusSign = {symbols, false});
    parser->addMatcher(parser->fLocalMatchers.plusSign = {symbols, false});
    parser->addMatcher(parser->fLocalMatchers.percent = {symbols});
    parser->addMatcher(parser->fLocalMatchers.permille = {symbols});
    parser->addMatcher(parser->fLocalMatchers.nan = {symbols});
    parser->addMatcher(parser->fLocalMatchers.infinity = {symbols});
    parser->addMatcher(parser->fLocalMatchers.padding = {u"@"});
    parser->addMatcher(parser->fLocalMatchers.scientific = {symbols, grouper});
    parser->addMatcher(parser->fLocalMatchers.currency = {currencySymbols, symbols, parseFlags, status});
//    parser.addMatcher(new RequireNumberMatcher());

    parser->freeze();
    return parser.orphan();
}